

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

char ** cmsysSystem_Parse_CommandForUnix(char *command,int flags)

{
  int flags_local;
  char *command_local;
  
  if (flags == 0) {
    command_local = (char *)kwsysSystem__ParseUnixCommand(command,0);
  }
  else {
    command_local = (char *)0x0;
  }
  return (char **)command_local;
}

Assistant:

char** kwsysSystem_Parse_CommandForUnix(const char* command, int flags)
{
  /* Validate the flags.  */
  if (flags != 0) {
    return 0;
  }

  /* Forward to our internal implementation.  */
  return kwsysSystem__ParseUnixCommand(command, flags);
}